

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_binbuf.c
# Opt level: O0

t_symbol * binbuf_realizedollsym(t_symbol *s,int ac,t_atom *av,int tonew)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  size_t local_838;
  unsigned_long n;
  t_atom dollarnull;
  int next;
  char *substr;
  char *str;
  char buf2 [1000];
  char local_418 [8];
  char buf [1000];
  int tonew_local;
  t_atom *av_local;
  int ac_local;
  t_symbol *s_local;
  
  pcVar4 = s->s_name;
  dollarnull.a_w._4_4_ = 0;
  n._0_4_ = 1;
  buf._996_4_ = tonew;
  iVar1 = canvas_getdollarzero();
  dollarnull.a_type = (t_atomtype)(float)iVar1;
  buf2[0x3df] = '\0';
  str._0_1_ = 0;
  pcVar2 = strchr(pcVar4,0x24);
  s_local = s;
  if ((pcVar2 != (char *)0x0) && ((long)pcVar2 - (long)pcVar4 < 1000)) {
    strncpy((char *)&str,pcVar4,(long)pcVar2 - (long)pcVar4);
    pcVar2[(long)(buf2 + (-8 - (long)pcVar4))] = '\0';
    while( true ) {
      substr = pcVar2 + 1;
      dollarnull.a_w._4_4_ = binbuf_expanddollsym(substr,local_418,(t_atom *)&n,ac,av,buf._996_4_);
      if ((int)dollarnull.a_w._4_4_ < 0) break;
      if (((buf._996_4_ == 0) && (dollarnull.a_w._4_4_ == 0)) && (local_418[0] == '\0')) {
        return (t_symbol *)0x0;
      }
      sVar3 = strlen((char *)&str);
      strncat((char *)&str,local_418,999 - sVar3);
      pcVar4 = substr + (int)dollarnull.a_w._4_4_;
      pcVar2 = strchr(pcVar4,0x24);
      if (pcVar2 == (char *)0x0) {
        sVar3 = strlen((char *)&str);
        strncat((char *)&str,pcVar4,999 - sVar3);
        break;
      }
      local_838 = (long)pcVar2 - (long)pcVar4;
      sVar3 = strlen((char *)&str);
      if (999 - sVar3 < local_838) {
        sVar3 = strlen((char *)&str);
        local_838 = 999 - sVar3;
      }
      strncat((char *)&str,pcVar4,local_838);
    }
    s_local = gensym((char *)&str);
  }
  return s_local;
}

Assistant:

t_symbol *binbuf_realizedollsym(t_symbol *s, int ac, const t_atom *av,
    int tonew)
{
    char buf[MAXPDSTRING];
    char buf2[MAXPDSTRING];
    const char*str=s->s_name;
    char*substr;
    int next=0;
    t_atom dollarnull;
    SETFLOAT(&dollarnull, canvas_getdollarzero());
    buf2[0] = buf2[MAXPDSTRING-1] = 0;

    substr=strchr(str, '$');
    if (!substr || substr-str >= MAXPDSTRING)
        return (s);

    strncpy(buf2, str, (substr-str));
    buf2[substr-str] = 0;
    str=substr+1;

    while((next=binbuf_expanddollsym(str, buf, &dollarnull, ac, av, tonew))>=0)
    {
        /*
        * JMZ: i am not sure what this means, so i might have broken it
        * it seems like that if "tonew" is set and the $arg cannot be expanded
        * (or the dollarsym is in reality a A_DOLLAR)
        * 0 is returned from binbuf_realizedollsym
        * this happens, when expanding in a message-box, but does not happen
        * when the A_DOLLSYM is the name of a subpatch
        */
        if (!tonew && (0==next) && (0==*buf))
        {
            return 0; /* JMZ: this should mimic the original behaviour */
        }

        strncat(buf2, buf, MAXPDSTRING-strlen(buf2)-1);
        str+=next;
        substr=strchr(str, '$');
        if (substr)
        {
            unsigned long n = substr-str;
            if(n>MAXPDSTRING-strlen(buf2)-1) n=MAXPDSTRING-strlen(buf2)-1;
            strncat(buf2, str, n);
            str=substr+1;
        }
        else
        {
            strncat(buf2, str, MAXPDSTRING-strlen(buf2)-1);
            goto done;
        }
    }
done:
    return (gensym(buf2));
}